

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::DecodeToggledCase::render(DecodeToggledCase *this)

{
  SRGBTestTexture *pSVar1;
  SRGBTestSampler *pSVar2;
  int iVar3;
  undefined4 extraout_var;
  pointer ppSVar5;
  pointer ppSVar6;
  pointer ppSVar7;
  TestError *this_00;
  pointer ppSVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar4;
  
  iVar3 = (*((this->super_SRGBTestCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [3])();
  lVar4 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar4 + 0x78))
            (0x8d40,(((this->super_SRGBTestCase).m_framebuffer.
                      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                      .m_data.ptr)->super_ObjectWrapper).m_object);
  (**(code **)(lVar4 + 0xd8))((this->super_SRGBTestCase).m_vaoID);
  ppSVar5 = (this->super_SRGBTestCase).m_shaderProgramList.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_SRGBTestCase).m_shaderProgramList.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppSVar5) {
    uVar9 = 0;
    do {
      (**(code **)(lVar4 + 0x1680))
                ((((ppSVar5[uVar9]->m_program).
                   super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.
                   m_data.ptr)->m_program).m_program);
      SRGBTestCase::toggleDecode
                (&this->super_SRGBTestCase,
                 &(this->super_SRGBTestCase).m_shaderProgramList.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar9]->m_uniformDataList);
      if (0 < (int)((ulong)((long)(this->super_SRGBTestCase).m_textureSourceList.
                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->super_SRGBTestCase).m_textureSourceList.
                                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
        uVar10 = 0;
        do {
          (**(code **)(lVar4 + 8))((int)uVar10 + 0x84c0);
          pSVar1 = (this->super_SRGBTestCase).m_textureSourceList.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar10];
          (**(code **)(lVar4 + 0xb8))
                    (-(uint)(pSVar1->m_targetType != TEXTURETYPE_2D) | 0xde1,
                     (pSVar1->m_source).m_glTexture);
          iVar3 = (**(code **)(lVar4 + 0xb48))
                            (*(undefined4 *)
                              ((long)((this->super_SRGBTestCase).m_shaderProgramList.
                                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar9]->m_program).
                                     super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                                     .m_data.ptr + 0x98));
          if (iVar3 == -1) {
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,(char *)0x0,"samplerUniformLocationID != (glw::GLuint) - 1",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSRGBDecodeTests.cpp"
                       ,0x6d2);
            __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          (**(code **)(lVar4 + 0x14f0))(iVar3,uVar10 & 0xffffffff);
          uVar10 = uVar10 + 1;
        } while ((long)uVar10 <
                 (long)(int)((ulong)((long)(this->super_SRGBTestCase).m_textureSourceList.
                                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->super_SRGBTestCase).m_textureSourceList.
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3));
      }
      ppSVar6 = (this->super_SRGBTestCase).m_samplerList.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppSVar8 = (this->super_SRGBTestCase).m_samplerList.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (0 < (int)((ulong)((long)ppSVar8 - (long)ppSVar6) >> 3)) {
        lVar11 = 0;
        do {
          pSVar2 = ppSVar6[lVar11];
          if (pSVar2->m_isActive == true) {
            (*pSVar2->m_gl->bindSampler)(pSVar2->m_textureUnit,pSVar2->m_samplerHandle);
            ppSVar6 = (this->super_SRGBTestCase).m_samplerList.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppSVar8 = (this->super_SRGBTestCase).m_samplerList.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < (int)((ulong)((long)ppSVar8 - (long)ppSVar6) >> 3));
      }
      if ((this->super_SRGBTestCase).m_shaderProgramList.
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar9]->m_blendRequired == false) {
        (**(code **)(lVar4 + 0x4e8))(0xbe2);
      }
      else {
        (**(code **)(lVar4 + 0x5e0))(0xbe2);
        (**(code **)(lVar4 + 0x100))(0x8008);
        (**(code **)(lVar4 + 0x120))(1,1);
      }
      (**(code **)(lVar4 + 0x538))(4,0,6);
      SRGBTestCase::toggleDecode
                (&this->super_SRGBTestCase,
                 &(this->super_SRGBTestCase).m_shaderProgramList.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar9]->m_uniformDataList);
      uVar9 = uVar9 + 1;
      ppSVar5 = (this->super_SRGBTestCase).m_shaderProgramList.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(this->super_SRGBTestCase).m_shaderProgramList.
                                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar5 >> 3))
    ;
  }
  ppSVar7 = (this->super_SRGBTestCase).m_textureSourceList.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_SRGBTestCase).m_textureSourceList.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppSVar7) {
    uVar9 = 0;
    do {
      (**(code **)(lVar4 + 0xb8))(-(uint)(ppSVar7[uVar9]->m_targetType != TEXTURETYPE_2D) | 0xde1,0)
      ;
      uVar9 = uVar9 + 1;
      ppSVar7 = (this->super_SRGBTestCase).m_textureSourceList.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(this->super_SRGBTestCase).m_textureSourceList.
                                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar7 >> 3))
    ;
  }
  (**(code **)(lVar4 + 0x78))(0x8d40,0);
  (**(code **)(lVar4 + 0xd8))(0);
  (**(code **)(lVar4 + 0x40))(0x8892,0);
  return;
}

Assistant:

void DecodeToggledCase::render (void)
{
	// override the base SRGBTestCase render function with the purpose of switching between shader programs,
	// toggling texture sRGB decode state between draw calls
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindFramebuffer(GL_FRAMEBUFFER, **m_framebuffer);
	gl.bindVertexArray(m_vaoID);

	for (std::size_t programIdx = 0; programIdx < m_shaderProgramList.size(); programIdx++)
	{
		gl.useProgram(m_shaderProgramList[programIdx]->getHandle());

		this->toggleDecode(m_shaderProgramList[programIdx]->getUniformDataList());

		for (int textureSourceIdx = 0; textureSourceIdx < (int)m_textureSourceList.size(); textureSourceIdx++)
		{
			gl.activeTexture(GL_TEXTURE0 + (glw::GLenum)textureSourceIdx);
			gl.bindTexture(m_textureSourceList[textureSourceIdx]->getGLTargetType(), m_textureSourceList[textureSourceIdx]->getHandle());
			glw::GLuint samplerUniformLocationID = gl.getUniformLocation(m_shaderProgramList[programIdx]->getHandle(), m_shaderProgramList[programIdx]->getUniformAtLocation(textureSourceIdx).name.c_str());
			TCU_CHECK(samplerUniformLocationID != (glw::GLuint) - 1);
			gl.uniform1i(samplerUniformLocationID, (glw::GLenum)textureSourceIdx);
		}

		for (int samplerIdx = 0; samplerIdx < (int)m_samplerList.size(); samplerIdx++)
		{
			if (m_samplerList[samplerIdx]->getIsActive() == true)
			{
				m_samplerList[samplerIdx]->bindToTexture();
			}
		}

		if (m_shaderProgramList[programIdx]->getBlendRequired() == true)
		{
			gl.enable(GL_BLEND);
			gl.blendEquation(GL_MAX);
			gl.blendFunc(GL_ONE, GL_ONE);
		}
		else
		{
			gl.disable(GL_BLEND);
		}

		gl.drawArrays(GL_TRIANGLES, 0, 6);

		// reset sRGB decode state on textures
		this->toggleDecode(m_shaderProgramList[programIdx]->getUniformDataList());
	}

	for (std::size_t textureSourceIdx = 0; textureSourceIdx < m_textureSourceList.size(); textureSourceIdx++)
	{
		gl.bindTexture(m_textureSourceList[textureSourceIdx]->getGLTargetType(), 0);
	}
	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	gl.bindVertexArray(0);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
}